

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void AArch64_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  arm64_reg aVar8;
  MCOperand *pMVar9;
  MCOperand *pMVar10;
  MCOperand *pMVar11;
  MCOperand *pMVar12;
  int64_t iVar13;
  int64_t iVar14;
  ulong uVar15;
  int64_t iVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  undefined **ppuVar20;
  uint val;
  char *pcVar21;
  int iVar22;
  uint32_t *RegAsmOffset;
  int iVar23;
  uint32_t *RegAsmOffset_1;
  char *AsmStrs_2;
  int iVar24;
  char *AsmStrs;
  bool bVar25;
  bool bVar26;
  
  uVar4 = MCInst_getOpcode(MI);
  if (uVar4 != 0x7c2) goto LAB_0016d9d5;
  pMVar9 = MCInst_getOperand(MI,0);
  pMVar10 = MCInst_getOperand(MI,1);
  pMVar11 = MCInst_getOperand(MI,2);
  pMVar12 = MCInst_getOperand(MI,3);
  iVar13 = MCOperand_getImm(pMVar9);
  iVar14 = MCOperand_getImm(pMVar10);
  uVar15 = MCOperand_getImm(pMVar11);
  iVar16 = MCOperand_getImm(pMVar12);
  iVar22 = (int)iVar13;
  uVar5 = (uint)iVar16;
  if ((int)iVar14 != 8) {
    if ((int)iVar14 != 7) {
      iVar24 = 0;
      iVar19 = 0;
      uVar7 = 0;
      iVar23 = 0;
      pcVar21 = (char *)0x0;
      uVar6 = 0;
      goto switchD_0016d41d_caseD_1;
    }
    uVar7 = 0;
    switch((int)uVar15) {
    case 1:
      iVar19 = 0;
      if (iVar22 == 0 && uVar5 == 0) {
        pcVar21 = "ic\tialluis";
        iVar24 = 1;
        uVar6 = 0x1c0;
        goto LAB_0016d70d;
      }
      break;
    default:
      break;
    case 4:
      if (uVar5 == 1 && iVar22 == 3) {
        pcVar21 = "dc\tzva";
        iVar19 = 1;
LAB_0016d648:
        iVar24 = 0;
        uVar6 = 0x1c1;
        goto LAB_0016d70d;
      }
      break;
    case 5:
      uVar6 = 0x1c0;
      if (iVar22 == 0 && uVar5 == 0) {
        pcVar21 = "ic\tiallu";
        iVar24 = 2;
LAB_0016e846:
        iVar19 = 0;
        goto LAB_0016d710;
      }
      iVar19 = 0;
      if (uVar5 == 1 && iVar22 == 3) {
        pcVar21 = "ic\tivau";
        iVar24 = 3;
        goto LAB_0016d70d;
      }
      break;
    case 6:
      bVar26 = iVar22 == 0;
      bVar25 = uVar5 == 1;
      iVar24 = 0;
      uVar6 = 0;
      if (bVar25 && bVar26) {
        uVar6 = 0x1c1;
      }
      pcVar21 = "dc\tivac";
      if (!bVar25 || !bVar26) {
        pcVar21 = (char *)0x0;
      }
      if (uVar5 == 2 && bVar26) {
        pcVar21 = "dc\tisw";
        iVar19 = 3;
        goto LAB_0016d648;
      }
      iVar19 = (uint)(bVar25 && bVar26) * 2;
LAB_0016d70d:
      uVar7 = 0;
LAB_0016d710:
      iVar23 = 0;
      goto switchD_0016d41d_caseD_1;
    case 8:
      if (iVar22 == 6) {
        iVar24 = 0;
        if (uVar5 == 1) {
          pcVar21 = "at\ts1e3w";
          uVar7 = 0xb;
        }
        else {
          if (uVar5 != 0) break;
          pcVar21 = "at\ts1e3r";
          uVar7 = 10;
        }
        uVar6 = 0x1c2;
        goto LAB_0016e846;
      }
      if (iVar22 == 4) {
        iVar24 = 0;
        if (uVar5 < 8) {
          uVar7 = (uVar5 & 7) * 4;
          uVar6 = *(uint *)(&DAT_001e75a4 + uVar7);
          uVar7 = *(uint *)(&DAT_001e75c4 + uVar7);
          pcVar21 = (&PTR_anon_var_dwarf_7410c_0028d2a0)[uVar5 & 7];
          goto LAB_0016e846;
        }
      }
      else if ((iVar22 == 0) && (iVar24 = 0, uVar5 < 4)) {
        pcVar21 = &DAT_001e5b0c + *(int *)(&DAT_001e5b0c + (ulong)(uVar5 & 3) * 4);
        uVar6 = 0x1c2;
        iVar19 = 0;
        uVar7 = uVar5;
        goto LAB_0016d710;
      }
      break;
    case 10:
      uVar6 = 0x1c1;
      if (uVar5 == 1 && iVar22 == 3) {
        pcVar21 = "dc\tcvac";
        iVar19 = 4;
LAB_0016d5d7:
        uVar6 = 0x1c1;
        iVar24 = 0;
        uVar7 = 0;
        goto LAB_0016d710;
      }
      iVar24 = 0;
      if (iVar22 == 0 && uVar5 == 2) {
        pcVar21 = "dc\tcsw";
        iVar19 = 5;
        goto LAB_0016d70d;
      }
      break;
    case 0xb:
      if (uVar5 == 1 && iVar22 == 3) {
        pcVar21 = "dc\tcvau";
        iVar19 = 6;
        goto LAB_0016d648;
      }
      break;
    case 0xe:
      uVar6 = 0x1c1;
      if (uVar5 == 1 && iVar22 == 3) {
        pcVar21 = "dc\tcivac";
        iVar19 = 7;
        goto LAB_0016d5d7;
      }
      iVar24 = 0;
      if (iVar22 == 0 && uVar5 == 2) {
        pcVar21 = "dc\tcisw";
        iVar19 = 8;
        goto LAB_0016d70d;
      }
    }
    goto LAB_0016d870;
  }
  uVar6 = 0;
  pcVar21 = (char *)0x0;
  iVar24 = 0;
  iVar19 = 0;
  uVar7 = 0;
  iVar23 = 0;
  switch(uVar15 & 0xffffffff) {
  case 0:
    if (iVar22 != 4) break;
    if (uVar5 == 5) {
      pcVar21 = "tlbi\tipas2le1is";
      iVar23 = 0x10;
    }
    else {
      if (uVar5 != 1) break;
      pcVar21 = "tlbi\tipas2e1is";
      iVar23 = 0xf;
    }
LAB_0016d804:
    uVar6 = 0x1c3;
LAB_0016d809:
    iVar24 = 0;
    iVar19 = 0;
    uVar7 = 0;
  case 1:
  case 2:
  case 5:
  case 6:
    goto switchD_0016d41d_caseD_1;
  case 3:
    if (iVar22 == 6) {
      if (uVar5 < 6) {
        uVar15 = (ulong)(uVar5 & 7);
        uVar5 = (uVar5 & 7) * 4;
        uVar6 = *(uint *)(&DAT_001e5b88 + uVar5);
        iVar23 = *(int *)(&DAT_001e5b38 + uVar5);
        ppuVar20 = &PTR_anon_var_dwarf_741f5_0028d358;
        goto LAB_0016d7e4;
      }
    }
    else if (iVar22 == 4) {
      if (uVar5 < 7) {
        uVar15 = (ulong)(uVar5 & 7);
        uVar5 = (uVar5 & 7) * 4;
        uVar6 = *(uint *)(&DAT_001e5b50 + uVar5);
        iVar23 = *(int *)(&DAT_001e5b1c + uVar5);
        ppuVar20 = &PTR_anon_var_dwarf_741b2_0028d320;
        goto LAB_0016d7e4;
      }
    }
    else if ((iVar22 == 0) && (uVar5 < 8)) {
      uVar15 = (ulong)(uVar5 & 7);
      uVar5 = (uVar5 & 7) * 4;
      uVar6 = *(uint *)(&DAT_001e7604 + uVar5);
      iVar23 = *(int *)(&DAT_001e75e4 + uVar5);
      ppuVar20 = &PTR_anon_var_dwarf_74164_0028d2e0;
LAB_0016d7e4:
      pcVar21 = ppuVar20[uVar15];
      goto LAB_0016d809;
    }
    break;
  case 4:
    if (iVar22 == 4) {
      if (uVar5 == 5) {
        pcVar21 = "tlbi\tipas2le1";
        iVar23 = 0x12;
      }
      else {
        if (uVar5 != 1) break;
        pcVar21 = "tlbi\tipas2e1";
        iVar23 = 0x11;
      }
      goto LAB_0016d804;
    }
    break;
  case 7:
    if (iVar22 == 6) {
      if (uVar5 < 6) {
        uVar15 = (ulong)(uVar5 & 7);
        uVar5 = (uVar5 & 7) * 4;
        uVar6 = *(uint *)(&DAT_001e5b88 + uVar5);
        iVar23 = *(int *)(&DAT_001e5ba0 + uVar5);
        ppuVar20 = &PTR_anon_var_dwarf_742c7_0028d400;
        goto LAB_0016d7e4;
      }
    }
    else if (iVar22 == 4) {
      if (uVar5 < 7) {
        uVar15 = (ulong)(uVar5 & 7);
        uVar5 = (uVar5 & 7) * 4;
        uVar6 = *(uint *)(&DAT_001e5b50 + uVar5);
        iVar23 = *(int *)(&DAT_001e5b6c + uVar5);
        ppuVar20 = &PTR_anon_var_dwarf_74290_0028d3c8;
        goto LAB_0016d7e4;
      }
    }
    else if ((iVar22 == 0) && (uVar5 < 8)) {
      uVar15 = (ulong)(uVar5 & 7);
      uVar5 = (uVar5 & 7) * 4;
      uVar6 = *(uint *)(&DAT_001e7604 + uVar5);
      iVar23 = *(int *)(&DAT_001e7624 + uVar5);
      ppuVar20 = &PTR_anon_var_dwarf_7424e_0028d388;
      goto LAB_0016d7e4;
    }
    break;
  default:
    iVar24 = 0;
    iVar19 = 0;
    goto LAB_0016d70d;
  }
LAB_0016d870:
  iVar24 = 0;
  uVar6 = 0;
  uVar7 = 0;
  iVar19 = 0;
  iVar23 = 0;
  pcVar21 = (char *)0x0;
switchD_0016d41d_caseD_1:
  if (pcVar21 != (char *)0x0) {
    MCInst_setOpcodePub(MI,uVar6);
    SStream_concat0(O,pcVar21);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = 'D';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar7 + iVar23 + iVar19 + iVar24;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
    pcVar17 = strstr(pcVar21,"all");
    if (pcVar17 == (char *)0x0) {
      pMVar9 = MCInst_getOperand(MI,4);
      uVar5 = MCOperand_getReg(pMVar9);
      SStream_concat(O,", %s",getRegisterName_AsmStrsNoRegAltName +
                              *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName +
                                       (ulong)(uVar5 - 1) * 4));
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             uVar5;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
      }
    }
    if (pcVar21 != (char *)0x0) {
      return;
    }
  }
LAB_0016d9d5:
  uVar5 = uVar4 & 0xfffffffe;
  bVar26 = uVar5 != 0x500;
  if ((1 < uVar4 - 0x81e) && (1 < uVar4 - 0x500)) {
    if (uVar5 != 0x66) {
      pcVar21 = printAliasInstr(MI,O,Info);
      if (pcVar21 == (char *)0x0) {
        printInstruction(MI,O,(MCRegisterInfo *)Info);
        return;
      }
      aVar8 = AArch64_map_insn(pcVar21);
      MCInst_setOpcodePub(MI,aVar8);
      (*cs_mem_free)(pcVar21);
      return;
    }
    pMVar9 = MCInst_getOperand(MI,0);
    pMVar10 = MCInst_getOperand(MI,2);
    pMVar11 = MCInst_getOperand(MI,3);
    iVar13 = MCOperand_getImm(pMVar11);
    pMVar11 = MCInst_getOperand(MI,4);
    iVar14 = MCOperand_getImm(pMVar11);
    iVar22 = (int)iVar14;
    iVar23 = (int)iVar13;
    if (iVar22 < iVar23) {
      iVar19 = (uint)(uVar4 == 0x67) * 0x20 + 0x20;
      iVar19 = (iVar19 - iVar23) % iVar19;
      uVar4 = MCOperand_getReg(pMVar9);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar5 = MCOperand_getReg(pMVar10);
      SStream_concat(O,"bfi\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar5 - 1) * 4));
      printInt32Bang(O,iVar19);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar22 + 1);
      aVar8 = AArch64_map_insn("bfi");
      MCInst_setOpcodePub(MI,aVar8);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar9);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar10);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (long)iVar19;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      lVar18 = (long)(iVar22 + 1);
    }
    else {
      iVar22 = (iVar22 - iVar23) + 1;
      uVar4 = MCOperand_getReg(pMVar9);
      uVar4 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar4 - 1) * 4);
      uVar5 = MCOperand_getReg(pMVar10);
      SStream_concat(O,"bfxil\t%s, %s, ",getRegisterName_AsmStrsNoRegAltName + uVar4,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar5 - 1) * 4));
      printInt32Bang(O,iVar23);
      SStream_concat0(O,", ");
      printInt32Bang(O,iVar22);
      aVar8 = AArch64_map_insn("bfxil");
      MCInst_setOpcodePub(MI,aVar8);
      if (MI->csh->detail == CS_OPT_OFF) {
        return;
      }
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar9);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar4 = MCOperand_getReg(pMVar10);
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           uVar4;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (long)iVar23;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      lVar18 = (long)iVar22;
    }
    goto LAB_0016e7a3;
  }
  pMVar9 = MCInst_getOperand(MI,0);
  pMVar10 = MCInst_getOperand(MI,1);
  pMVar11 = MCInst_getOperand(MI,2);
  pMVar12 = MCInst_getOperand(MI,3);
  _Var3 = MCOperand_isImm(pMVar11);
  if ((_Var3) &&
     ((iVar13 = MCOperand_getImm(pMVar11), iVar13 == 0 && (_Var3 = MCOperand_isImm(pMVar12), _Var3))
     )) {
    iVar13 = MCOperand_getImm(pMVar12);
    bVar25 = true;
    if (iVar13 == 0x1f) {
      if ((uVar4 == 0x81f) || (uVar4 == 0x501)) {
        pcVar21 = (char *)0x0;
        if (uVar5 == 0x500) {
          pcVar21 = "sxtw";
        }
      }
      else {
LAB_0016dfca:
        pcVar21 = (char *)0x0;
        bVar26 = bVar25;
      }
    }
    else {
      if (iVar13 == 0xf) {
        if (uVar5 == 0x500) {
          pcVar21 = "sxth";
        }
        else {
          pcVar21 = (char *)0x0;
          bVar26 = bVar25;
          if ((uVar4 == 0x501) || (uVar4 == 0x81f)) goto LAB_0016dfe0;
          pcVar21 = "uxth";
        }
      }
      else {
        if (iVar13 != 7) goto LAB_0016dfca;
        if (uVar5 == 0x500) {
          pcVar21 = "sxtb";
        }
        else {
          pcVar21 = (char *)0x0;
          bVar26 = true;
          if ((uVar4 == 0x501) || (bVar26 = bVar25, uVar4 == 0x81f)) goto LAB_0016dfe0;
          pcVar21 = "uxtb";
        }
      }
      bVar26 = false;
    }
LAB_0016dfe0:
    if (!bVar26) {
      uVar6 = MCOperand_getReg(pMVar9);
      uVar6 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 4);
      uVar7 = MCOperand_getReg(pMVar10);
      uVar7 = getWRegFromXReg(uVar7);
      SStream_concat(O,"%s\t%s, %s",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar6,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar7 - 1) * 4));
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar9);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        uVar6 = getWRegFromXReg(uVar6);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
      }
      aVar8 = AArch64_map_insn(pcVar21);
      MCInst_setOpcodePub(MI,aVar8);
      if (!bVar26) {
        return;
      }
    }
  }
  _Var3 = MCOperand_isImm(pMVar11);
  if ((_Var3) && (_Var3 = MCOperand_isImm(pMVar12), _Var3)) {
    iVar13 = MCOperand_getImm(pMVar11);
    iVar14 = MCOperand_getImm(pMVar12);
    uVar6 = (uint)iVar14;
    val = (uint)iVar13;
    uVar7 = uVar6 + 1 ^ val;
    if (((uVar4 ^ 0x81e) == 0 && uVar7 == 0) && uVar6 != 0x1f) {
      iVar22 = 0x1f;
LAB_0016e1ba:
      val = iVar22 - uVar6;
      pcVar21 = "lsl";
LAB_0016e1c3:
      bVar26 = false;
    }
    else {
      if ((uVar7 == 0 && (uVar4 ^ 0x81f) == 0) && uVar6 != 0x3f) {
        iVar22 = 0x3f;
        goto LAB_0016e1ba;
      }
      pcVar21 = "lsr";
      if (((((uVar4 ^ 0x81e) == 0 && (uVar6 ^ 0x1f) == 0) ||
           ((uVar4 ^ 0x81f) == 0 && (uVar6 ^ 0x3f) == 0)) ||
          (pcVar21 = "asr", uVar4 == 0x500 && (uVar6 ^ 0x1f) == 0)) ||
         (uVar4 == 0x501 && (uVar6 ^ 0x3f) == 0)) goto LAB_0016e1c3;
      bVar26 = true;
      val = 0;
      pcVar21 = (char *)0x0;
    }
    if (!bVar26) {
      uVar6 = MCOperand_getReg(pMVar9);
      uVar6 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 4);
      uVar7 = MCOperand_getReg(pMVar10);
      SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar6,
                     getRegisterName_AsmStrsNoRegAltName +
                     *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar7 - 1) * 4));
      printInt32Bang(O,val);
      aVar8 = AArch64_map_insn(pcVar21);
      MCInst_setOpcodePub(MI,aVar8);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar9);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(pMVar10);
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             uVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
             (long)(int)val;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
      }
      if (!bVar26) {
        return;
      }
    }
  }
  iVar13 = MCOperand_getImm(pMVar11);
  iVar14 = MCOperand_getImm(pMVar12);
  uVar6 = MCOperand_getReg(pMVar9);
  uVar6 = *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar6 - 1) * 4);
  uVar7 = MCOperand_getReg(pMVar10);
  if (iVar14 < iVar13) {
    pcVar21 = "sbfiz";
    if (uVar5 != 0x500) {
      pcVar21 = "ubfiz";
    }
    SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar6,
                   getRegisterName_AsmStrsNoRegAltName +
                   *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar7 - 1) * 4));
    iVar22 = (uint)(uVar4 == 0x501 || uVar4 == 0x81f) * 0x20 + 0x20;
    iVar13 = MCOperand_getImm(pMVar11);
    printInt32Bang(O,iVar22 - (int)iVar13);
    SStream_concat0(O,", ");
    iVar13 = MCOperand_getImm(pMVar12);
    printInt32Bang(O,(int)iVar13 + 1);
    aVar8 = AArch64_map_insn(pcVar21);
    MCInst_setOpcodePub(MI,aVar8);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(pMVar9);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4
    ;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(pMVar10);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4
    ;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    iVar13 = MCOperand_getImm(pMVar11);
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)(iVar22 - (int)iVar13);
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    iVar13 = MCOperand_getImm(pMVar12);
    lVar18 = (long)((int)iVar13 + 1);
  }
  else {
    pcVar21 = "sbfx";
    if (uVar5 != 0x500) {
      pcVar21 = "ubfx";
    }
    SStream_concat(O,"%s\t%s, %s, ",pcVar21,getRegisterName_AsmStrsNoRegAltName + uVar6,
                   getRegisterName_AsmStrsNoRegAltName +
                   *(uint *)(getRegisterName_RegAsmOffsetNoRegAltName + (ulong)(uVar7 - 1) * 4));
    iVar13 = MCOperand_getImm(pMVar11);
    printInt32Bang(O,(int32_t)iVar13);
    SStream_concat0(O,", ");
    iVar13 = MCOperand_getImm(pMVar12);
    iVar14 = MCOperand_getImm(pMVar11);
    printInt32Bang(O,((int)iVar13 - (int)iVar14) + 1);
    aVar8 = AArch64_map_insn(pcVar21);
    MCInst_setOpcodePub(MI,aVar8);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(pMVar9);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4
    ;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(pMVar10);
    pcVar2 = MI->flat_insn->detail;
    *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = uVar4
    ;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    iVar13 = MCOperand_getImm(pMVar11);
    pcVar2 = MI->flat_insn->detail;
    *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
         (long)(int)iVar13;
    puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar1 = *puVar1 + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    iVar13 = MCOperand_getImm(pMVar12);
    iVar14 = MCOperand_getImm(pMVar11);
    lVar18 = (long)(((int)iVar13 - (int)iVar14) + 1);
  }
LAB_0016e7a3:
  pcVar2 = MI->flat_insn->detail;
  *(long *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) = lVar18;
  puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
  *puVar1 = *puVar1 + '\x01';
  return;
}

Assistant:

void AArch64_printInst(MCInst *MI, SStream *O, void *Info)
{
	// Check for special encodings and print the canonical alias instead.
	unsigned Opcode = MCInst_getOpcode(MI);
	int LSB;
	int Width;
	char *mnem;

	if (Opcode == AArch64_SYSxt && printSysAlias(MI, O))
		return;

	// SBFM/UBFM should print to a nicer aliased form if possible.
	if (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri ||
			Opcode == AArch64_UBFMXri || Opcode == AArch64_UBFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0);
		MCOperand *Op1 = MCInst_getOperand(MI, 1);
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		MCOperand *Op3 = MCInst_getOperand(MI, 3);

		bool IsSigned = (Opcode == AArch64_SBFMXri || Opcode == AArch64_SBFMWri);
		bool Is64Bit = (Opcode == AArch64_SBFMXri || Opcode == AArch64_UBFMXri);

		if (MCOperand_isImm(Op2) && MCOperand_getImm(Op2) == 0 && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;

			switch (MCOperand_getImm(Op3)) {
				default:
					break;
				case 7:
					if (IsSigned)
						AsmMnemonic = "sxtb";
					else if (!Is64Bit)
						AsmMnemonic = "uxtb";
					break;
				case 15:
					if (IsSigned)
						AsmMnemonic = "sxth";
					else if (!Is64Bit)
						AsmMnemonic = "uxth";
					break;
				case 31:
					// *xtw is only valid for signed 64-bit operations.
					if (Is64Bit && IsSigned)
						AsmMnemonic = "sxtw";
					break;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(getWRegFromXReg(MCOperand_getReg(Op1)), AArch64_NoRegAltName));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = getWRegFromXReg(MCOperand_getReg(Op1));
					MI->flat_insn->detail->arm64.op_count++;
				}

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				return;
			}
		}

		// All immediate shifts are aliases, implemented using the Bitfield
		// instruction. In all cases the immediate shift amount shift must be in
		// the range 0 to (reg.size -1).
		if (MCOperand_isImm(Op2) && MCOperand_isImm(Op3)) {
			char *AsmMnemonic = NULL;
			int shift = 0;
			int immr = (int)MCOperand_getImm(Op2);
			int imms = (int)MCOperand_getImm(Op3);

			if (Opcode == AArch64_UBFMWri && imms != 0x1F && ((imms + 1) == immr)) {
				AsmMnemonic = "lsl";
				shift = 31 - imms;
			} else if (Opcode == AArch64_UBFMXri && imms != 0x3f &&
					((imms + 1 == immr))) {
				AsmMnemonic = "lsl";
				shift = 63 - imms;
			} else if (Opcode == AArch64_UBFMWri && imms == 0x1f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_UBFMXri && imms == 0x3f) {
				AsmMnemonic = "lsr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMWri && imms == 0x1f) {
				AsmMnemonic = "asr";
				shift = immr;
			} else if (Opcode == AArch64_SBFMXri && imms == 0x3f) {
				AsmMnemonic = "asr";
				shift = immr;
			}

			if (AsmMnemonic) {
				SStream_concat(O, "%s\t%s, %s, ", AsmMnemonic,
						getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
						getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));

				printInt32Bang(O, shift);

				MCInst_setOpcodePub(MI, AArch64_map_insn(AsmMnemonic));

				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
					MI->flat_insn->detail->arm64.op_count++;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = shift;
					MI->flat_insn->detail->arm64.op_count++;
				}

				return;
			}
		}

		// SBFIZ/UBFIZ aliases
		if (MCOperand_getImm(Op2) > MCOperand_getImm(Op3)) {
			SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfiz" : "ubfiz"),
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
			printInt32Bang(O, (int)((Is64Bit ? 64 : 32) - MCOperand_getImm(Op2)));
			SStream_concat0(O, ", ");
			printInt32Bang(O, (int)MCOperand_getImm(Op3) + 1);

			MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfiz" : "ubfiz"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (Is64Bit ? 64 : 32) - (int)MCOperand_getImm(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) + 1;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		// Otherwise SBFX/UBFX is the preferred form
		SStream_concat(O, "%s\t%s, %s, ", (IsSigned ? "sbfx" : "ubfx"),
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op1), AArch64_NoRegAltName));
		printInt32Bang(O, (int)MCOperand_getImm(Op2));
		SStream_concat0(O, ", ");
		printInt32Bang(O, (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1);

		MCInst_setOpcodePub(MI, AArch64_map_insn(IsSigned ? "sbfx" : "ubfx"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op1);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)MCOperand_getImm(Op3) - (int)MCOperand_getImm(Op2) + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	if (Opcode == AArch64_BFMXri || Opcode == AArch64_BFMWri) {
		MCOperand *Op0 = MCInst_getOperand(MI, 0); // Op1 == Op0
		MCOperand *Op2 = MCInst_getOperand(MI, 2);
		int ImmR = (int)MCOperand_getImm(MCInst_getOperand(MI, 3));
		int ImmS = (int)MCOperand_getImm(MCInst_getOperand(MI, 4));

		// BFI alias
		if (ImmS < ImmR) {
			int BitWidth = Opcode == AArch64_BFMXri ? 64 : 32;
			LSB = (BitWidth - ImmR) % BitWidth;
			Width = ImmS + 1;

			SStream_concat(O, "bfi\t%s, %s, ",
					getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
					getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
			printInt32Bang(O, LSB);
			SStream_concat0(O, ", ");
			printInt32Bang(O, Width);
			MCInst_setOpcodePub(MI, AArch64_map_insn("bfi"));

			if (MI->csh->detail) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
				MI->flat_insn->detail->arm64.op_count++;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
				MI->flat_insn->detail->arm64.op_count++;
			}

			return;
		}

		LSB = ImmR;
		Width = ImmS - ImmR + 1;
		// Otherwise BFXIL the preferred form
		SStream_concat(O, "bfxil\t%s, %s, ",
				getRegisterName(MCOperand_getReg(Op0), AArch64_NoRegAltName),
				getRegisterName(MCOperand_getReg(Op2), AArch64_NoRegAltName));
		printInt32Bang(O, LSB);
		SStream_concat0(O, ", ");
		printInt32Bang(O, Width);
		MCInst_setOpcodePub(MI, AArch64_map_insn("bfxil"));

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op0);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = MCOperand_getReg(Op2);
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = LSB;
			MI->flat_insn->detail->arm64.op_count++;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Width;
			MI->flat_insn->detail->arm64.op_count++;
		}

		return;
	}

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		MCInst_setOpcodePub(MI, AArch64_map_insn(mnem));
		cs_mem_free(mnem);
	} else {
		printInstruction(MI, O, Info);
	}
}